

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O2

void __thiscall CVmImageWriter::begin_mhls_block(CVmImageWriter *this)

{
  long lVar1;
  
  begin_block(this,"MHLS",0);
  lVar1 = CVmFile::get_pos(this->fp_);
  this->mhls_cnt_pos_ = lVar1;
  CVmFile::write_uint4(this->fp_,0);
  this->mhls_cnt_ = 0;
  return;
}

Assistant:

void CVmImageWriter::begin_mhls_block()
{
    /* 
     *   begin the block - MHLS blocks are always optional, since they're
     *   purely for debugging purposes 
     */
    begin_block("MHLS", FALSE);

    /* remember where the count goes so we can fix it up later */
    mhls_cnt_pos_ = fp_->get_pos();

    /* write a placehodler count */
    fp_->write_uint4(0);

    /* there are no entries yet */
    mhls_cnt_ = 0;
}